

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

bool deqp::gles3::Functional::anon_unknown_0::compareColoredPixels(IVec4 *a,IVec4 *b)

{
  int iVar1;
  ulong uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  Vector<bool,_4> res_2;
  Vector<int,_4> res;
  Vector<int,_4> res_1;
  IVec4 threshold;
  
  if (a->m_data[1] == 0 && a->m_data[0] == 0) {
    bVar6 = a->m_data[2] == 0;
  }
  else {
    bVar6 = false;
  }
  if (b->m_data[1] == 0 && b->m_data[0] == 0) {
    bVar7 = b->m_data[2] == 0;
  }
  else {
    bVar7 = false;
  }
  threshold.m_data[0] = 0x14;
  threshold.m_data[1] = 0x14;
  threshold.m_data[2] = 0x14;
  threshold.m_data[3] = 0;
  if ((bVar6 & bVar7) != 0) {
    return true;
  }
  if (bVar6 == bVar7) {
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar3 = 0;
    do {
      res.m_data[lVar3] = a->m_data[lVar3] - b->m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    res_1.m_data[0] = 0;
    res_1.m_data[1] = 0;
    res_1.m_data[2] = 0;
    res_1.m_data[3] = 0;
    lVar3 = 0;
    do {
      iVar1 = res.m_data[lVar3];
      iVar5 = -iVar1;
      if (0 < iVar1) {
        iVar5 = iVar1;
      }
      res_1.m_data[lVar3] = iVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    res_2.m_data[0] = false;
    res_2.m_data[1] = false;
    res_2.m_data[2] = false;
    res_2.m_data[3] = false;
    lVar3 = 0;
    do {
      res_2.m_data[lVar3] = res_1.m_data[lVar3] <= threshold.m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    if (res_2.m_data[0] != false) {
      uVar2 = 0;
      do {
        uVar4 = uVar2;
        if (uVar4 == 3) break;
        uVar2 = uVar4 + 1;
      } while (res_2.m_data[uVar4 + 1] != false);
      return 2 < uVar4;
    }
  }
  return false;
}

Assistant:

inline bool compareColoredPixels (const tcu::IVec4& a, const tcu::IVec4& b)
{
	const bool aIsBlack = isBlack(a);
	const bool bIsBlack = isBlack(b);
	const tcu::IVec4 threshold(20, 20, 20, 0);

	if (aIsBlack && bIsBlack)
		return true;
	if (aIsBlack != bIsBlack)
		return false;

	return tcu::boolAll(tcu::lessThanEqual(tcu::abs(a - b), threshold));
}